

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

FilterInfo * __thiscall
helics::FilterFederate::createFilter
          (FilterFederate *this,GlobalBrokerId dest,InterfaceHandle handle,string_view key,
          string_view type_in,string_view type_out,bool cloning)

{
  bool bVar1;
  pointer pFVar2;
  InterfaceHandle in_EDX;
  BaseType in_ESI;
  MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *in_RDI;
  byte in_R9B;
  FilterInfo *retTarget;
  GlobalBrokerId cid;
  __single_object filt;
  GlobalFederateId *in_stack_ffffffffffffff28;
  unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>
  *in_stack_ffffffffffffff30;
  unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_> *ptr;
  GlobalHandle *searchValue;
  GlobalFederateId local_5c;
  GlobalHandle in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  GlobalBrokerId id;
  undefined4 in_stack_ffffffffffffffc0;
  GlobalBrokerId in_stack_ffffffffffffffc4;
  undefined4 uVar3;
  MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *__args_5;
  GlobalBrokerId local_4;
  
  ptr = (unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_> *)&stack0x00000018
  ;
  searchValue = (GlobalHandle *)&stack0x00000008;
  uVar3 = 0;
  __args_5 = in_RDI;
  local_4.gid = in_ESI;
  bVar1 = GlobalBrokerId::operator==(&local_4,(GlobalBrokerId)0x0);
  if (!bVar1) {
    in_stack_ffffffffffffffc4.gid =
         *(BaseType *)
          ((long)&(in_RDI->dataStorage).
                  super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
    bVar1 = GlobalBrokerId::operator==(&local_4,in_stack_ffffffffffffffc4);
    if (!bVar1) goto LAB_0057d92f;
  }
  local_4 = GlobalFederateId::operator_cast_to_GlobalBrokerId(in_stack_ffffffffffffff28);
LAB_0057d92f:
  std::
  make_unique<helics::FilterInfo,helics::GlobalBrokerId,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,bool>
            ((GlobalBrokerId *)CONCAT44(local_4.gid,uVar3),
             (InterfaceHandle *)
             (CONCAT44(in_stack_ffffffffffffffc4.gid,in_stack_ffffffffffffffc0) & 0xffffffff00ffffff
             ),(basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,
             (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffa8,
             (bool *)__args_5);
  pFVar2 = std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>::operator->
                     ((unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_> *)
                      0x57d983);
  id.gid = (pFVar2->core_id).gid;
  pFVar2 = std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>::get
                     (in_stack_ffffffffffffff30);
  pFVar2->cloning = (bool)(in_R9B & 1);
  GlobalFederateId::GlobalFederateId(&local_5c,id);
  GlobalHandle::GlobalHandle((GlobalHandle *)&stack0xffffffffffffffa8,local_5c,in_EDX);
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::insert
            (in_RDI,searchValue,ptr);
  std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>::~unique_ptr
            (in_stack_ffffffffffffff30);
  return pFVar2;
}

Assistant:

FilterInfo* FilterFederate::createFilter(GlobalBrokerId dest,
                                         InterfaceHandle handle,
                                         std::string_view key,
                                         std::string_view type_in,
                                         std::string_view type_out,
                                         bool cloning)
{
    auto filt = std::make_unique<FilterInfo>((dest == parent_broker_id || dest == mCoreID) ?
                                                 GlobalBrokerId(mFedID) :
                                                 dest,
                                             handle,
                                             key,
                                             type_in,
                                             type_out,
                                             false);

    auto cid = filt->core_id;
    auto* retTarget = filt.get();
    // auto actualKey = key;
    retTarget->cloning = cloning;
    // if (actualKey.empty()) {
    // actualKey = "sFilter_";
    // actualKey.append(std::to_string(handle.baseValue()));
    // }

    // if (filt->core_id == mFedID) {
    filters.insert({cid, handle}, std::move(filt));
    //} else {
    // actualKey.push_back('_');
    //  actualKey.append(std::to_string(cid.baseValue()));
    //    filters.insert({cid, handle}, std::move(filt));
    //}

    return retTarget;
}